

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::~Vector
          (Vector<capnp::compiler::NodeTranslator::BrandScope_*> *this)

{
  BrandScope **ppBVar1;
  RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *ppBVar2;
  BrandScope **ppBVar3;
  ArrayDisposer *pAVar4;
  
  ppBVar1 = (this->builder).ptr;
  if (ppBVar1 != (BrandScope **)0x0) {
    ppBVar2 = (this->builder).pos;
    ppBVar3 = (this->builder).endPtr;
    (this->builder).ptr = (BrandScope **)0x0;
    (this->builder).pos = (RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *)0x0;
    (this->builder).endPtr = (BrandScope **)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,ppBVar1,8,(long)ppBVar2 - (long)ppBVar1 >> 3,
               (long)ppBVar3 - (long)ppBVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }